

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeNonAtomicLoad(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var1;
  double dVar2;
  int8_t iVar3;
  byte bVar4;
  uint32_t uVar5;
  uint uVar6;
  Expression *pEVar7;
  Expression *pEVar8;
  ulong uVar9;
  uintptr_t local_48;
  uintptr_t uStack_40;
  
  this_00 = &this->random;
  iVar3 = Random::get(this_00);
  dVar2 = log((double)(iVar3 + 1 + (uint)(iVar3 == -1)));
  dVar2 = floor(dVar2);
  pEVar7 = makePointer(this);
  if (6 < type.id) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  if (6 < (uint)type.id) {
    ::wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xb7e);
  }
  uVar9 = (ulong)dVar2;
  switch(type.id & 0xffffffff) {
  default:
    ::wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xb7c);
  case 2:
    bVar4 = Random::get(this_00);
    bVar4 = bVar4 & 1;
    uVar5 = Random::upTo(this_00,3);
    if (uVar5 == 2) {
switchD_0014c85b_caseD_2:
      uVar6 = Random::pick<int,int,int>(this_00,1,2,4);
      _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
      local_48 = *(uintptr_t *)
                  _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                  .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      uStack_40 = *(uintptr_t *)
                   ((long)_Var1.
                          super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                          .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
      pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x48,8);
      pEVar8->_id = LoadId;
      pEVar8[1].type.id = 0;
      *(undefined8 *)(pEVar8 + 2) = 0;
      *(undefined1 *)&pEVar8[2].type.id = 0;
      pEVar8[1]._id = BreakId;
      goto LAB_0014cab1;
    }
    if (uVar5 == 1) goto switchD_0014c85b_caseD_1;
    if (uVar5 != 0) {
      ::wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xb48);
    }
switchD_0014c85b_caseD_0:
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_48 = *(uintptr_t *)
                _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uStack_40 = *(uintptr_t *)
                 ((long)_Var1.
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x48,8);
    pEVar8->_id = LoadId;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    *(undefined1 *)&pEVar8[2].type.id = 0;
    pEVar8[1]._id = BlockId;
    pEVar8[1].field_0x1 = bVar4;
    pEVar8[1].type.id = uVar9 & 0xffffffff;
    *(undefined8 *)(pEVar8 + 2) = 1;
    goto LAB_0014cac0;
  case 3:
    bVar4 = Random::get(this_00);
    uVar5 = Random::upTo(this_00,4);
    if (3 < uVar5) {
      ::wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xb64);
    }
    bVar4 = bVar4 & 1;
    switch(uVar5) {
    case 0:
      goto switchD_0014c85b_caseD_0;
    case 1:
switchD_0014c85b_caseD_1:
      uVar6 = Random::pick<int,int>(this_00,1,2);
      _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
      local_48 = *(uintptr_t *)
                  _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                  .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      uStack_40 = *(uintptr_t *)
                   ((long)_Var1.
                          super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                          .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
      pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x48,8);
      pEVar8->_id = LoadId;
      pEVar8[1].type.id = 0;
      *(undefined8 *)(pEVar8 + 2) = 0;
      *(undefined1 *)&pEVar8[2].type.id = 0;
      pEVar8[1]._id = IfId;
      break;
    case 2:
      goto switchD_0014c85b_caseD_2;
    case 3:
      uVar6 = Random::pick<int,int,int,int>(this_00,1,2,4,8);
      _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
      local_48 = *(uintptr_t *)
                  _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                  .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      uStack_40 = *(uintptr_t *)
                   ((long)_Var1.
                          super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                          .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
      pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x48,8);
      pEVar8->_id = LoadId;
      pEVar8[1].type.id = 0;
      *(undefined8 *)(pEVar8 + 2) = 0;
      *(undefined1 *)&pEVar8[2].type.id = 0;
      pEVar8[1]._id = LocalGetId;
    }
LAB_0014cab1:
    pEVar8[1].field_0x1 = bVar4;
    pEVar8[1].type.id = uVar9 & 0xffffffff;
    *(ulong *)(pEVar8 + 2) = (ulong)uVar6;
LAB_0014cac0:
    *(Expression **)(pEVar8 + 3) = pEVar7;
    goto LAB_0014cac8;
  case 4:
    uVar6 = Random::pick<int,int,int>(this_00,1,2,4);
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_48 = *(uintptr_t *)
                _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uStack_40 = *(uintptr_t *)
                 ((long)_Var1.
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x48,8);
    pEVar8->_id = LoadId;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    *(undefined1 *)&pEVar8[2].type.id = 0;
    *(undefined2 *)(pEVar8 + 1) = 4;
    break;
  case 5:
    uVar6 = Random::pick<int,int,int,int>(this_00,1,2,4,8);
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_48 = *(uintptr_t *)
                _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uStack_40 = *(uintptr_t *)
                 ((long)_Var1.
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x48,8);
    pEVar8->_id = LoadId;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    *(undefined1 *)&pEVar8[2].type.id = 0;
    *(undefined2 *)(pEVar8 + 1) = 8;
    break;
  case 6:
    if (((this->wasm->features).features & 8) == 0) {
      pEVar7 = makeTrivial(this,type);
      return pEVar7;
    }
    uVar6 = Random::pick<int,int,int,int,int>(this_00,1,2,4,8,0x10);
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_48 = *(uintptr_t *)
                _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uStack_40 = *(uintptr_t *)
                 ((long)_Var1.
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x48,8);
    pEVar8->_id = LoadId;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    *(undefined1 *)&pEVar8[2].type.id = 0;
    *(undefined2 *)(pEVar8 + 1) = 0x10;
  }
  pEVar8[1].type.id = uVar9 & 0xffffffff;
  *(ulong *)(pEVar8 + 2) = (ulong)uVar6;
  *(Expression **)(pEVar8 + 3) = pEVar7;
LAB_0014cac8:
  (pEVar8->type).id = type.id;
  pEVar8[3].type.id = local_48;
  *(uintptr_t *)(pEVar8 + 4) = uStack_40;
  ::wasm::Load::finalize();
  return pEVar8;
}

Assistant:

Expression* TranslateToFuzzReader::makeNonAtomicLoad(Type type) {
  auto offset = logify(get());
  auto ptr = makePointer();
  switch (type.getBasic()) {
    case Type::i32: {
      bool signed_ = get() & 1;
      switch (upTo(3)) {
        case 0:
          return builder.makeLoad(
            1, signed_, offset, 1, ptr, type, wasm.memories[0]->name);
        case 1:
          return builder.makeLoad(
            2, signed_, offset, pick(1, 2), ptr, type, wasm.memories[0]->name);
        case 2:
          return builder.makeLoad(4,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("unexpected value");
    }
    case Type::i64: {
      bool signed_ = get() & 1;
      switch (upTo(4)) {
        case 0:
          return builder.makeLoad(
            1, signed_, offset, 1, ptr, type, wasm.memories[0]->name);
        case 1:
          return builder.makeLoad(
            2, signed_, offset, pick(1, 2), ptr, type, wasm.memories[0]->name);
        case 2:
          return builder.makeLoad(4,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
        case 3:
          return builder.makeLoad(8,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4, 8),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("unexpected value");
    }
    case Type::f32: {
      return builder.makeLoad(
        4, false, offset, pick(1, 2, 4), ptr, type, wasm.memories[0]->name);
    }
    case Type::f64: {
      return builder.makeLoad(
        8, false, offset, pick(1, 2, 4, 8), ptr, type, wasm.memories[0]->name);
    }
    case Type::v128: {
      if (!wasm.features.hasSIMD()) {
        return makeTrivial(type);
      }
      return builder.makeLoad(16,
                              false,
                              offset,
                              pick(1, 2, 4, 8, 16),
                              ptr,
                              type,
                              wasm.memories[0]->name);
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
  WASM_UNREACHABLE("invalid type");
}